

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O2

void __thiscall
YAML::SingleDocParser::ParseProperties
          (SingleDocParser *this,string *tag,anchor_t *anchor,string *anchor_name)

{
  bool bVar1;
  Token *pTVar2;
  
  tag->_M_string_length = 0;
  *(tag->_M_dataplus)._M_p = '\0';
  anchor_name->_M_string_length = 0;
  *(anchor_name->_M_dataplus)._M_p = '\0';
  *anchor = 0;
  while( true ) {
    while( true ) {
      bVar1 = Scanner::empty(this->m_scanner);
      if (bVar1) {
        return;
      }
      pTVar2 = Scanner::peek(this->m_scanner);
      if (pTVar2->type != ANCHOR) break;
      ParseAnchor(this,anchor,anchor_name);
    }
    if (pTVar2->type != TAG) break;
    ParseTag(this,tag);
  }
  return;
}

Assistant:

void SingleDocParser::ParseProperties(std::string& tag, anchor_t& anchor,
                                      std::string& anchor_name) {
  tag.clear();
  anchor_name.clear();
  anchor = NullAnchor;

  while (true) {
    if (m_scanner.empty())
      return;

    switch (m_scanner.peek().type) {
      case Token::TAG:
        ParseTag(tag);
        break;
      case Token::ANCHOR:
        ParseAnchor(anchor, anchor_name);
        break;
      default:
        return;
    }
  }
}